

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O3

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(short lhs,SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  undefined6 in_register_0000003a;
  short ret;
  short local_e;
  char local_b;
  short local_a;
  
  local_e = lhs;
  if (rhs.m_int != -1 || (int)CONCAT62(in_register_0000003a,lhs) != -0x8000) {
    local_a = 0;
    local_b = rhs.m_int;
    DivisionHelper<short,_signed_char,_5>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_e,&local_b,&local_a);
    if ((char)local_a == local_a) {
      return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
             (char)local_a;
    }
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}